

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::send_byte(Spi *this,uint8_t data)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  BYTE byOutputBuffer [1];
  DWORD dwNumBytesSent;
  
  byOutputBuffer[0] = data;
  iVar1 = FT_Write(this->ftHandle,byOutputBuffer,1);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Write error (single byte, received ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pcVar3 = ", expected 1).";
  }
  else {
    poVar2 = (ostream *)&std::cerr;
    pcVar3 = "Write error!";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  error(this,2);
}

Assistant:

void Spi::send_byte(uint8_t data) {
	FT_STATUS ftStatus;
	BYTE byOutputBuffer[1];
	DWORD dwNumBytesSent = 0;

	byOutputBuffer[0] = data;

	ftStatus = FT_Write(ftHandle, byOutputBuffer, 1, &dwNumBytesSent);
	if (ftStatus != FT_OK) {
		cerr << "Write error!" << endl;
		error(2);
	}
	if (dwNumBytesSent != 1) {
		cerr << "Write error (single byte, received " << dwNumBytesSent
				<< ", expected 1)." << endl;
		error(2);
	}
}